

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OFFLoader.cpp
# Opt level: O2

void __thiscall
Assimp::OFFImporter::InternReadFile
          (OFFImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  char *pcVar1;
  pointer end;
  bool bVar2;
  uint dim_1;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  DeadlyImportError *pDVar6;
  undefined4 extraout_var_00;
  aiMesh **ppaVar7;
  aiMesh *this_00;
  ulong *puVar8;
  aiVector3D *paVar9;
  aiVector3D *__s;
  aiColor4D *paVar10;
  Logger *pLVar11;
  uint *puVar12;
  aiNode *paVar13;
  aiMaterial **ppaVar14;
  aiMaterial *this_01;
  char *pcVar15;
  aiFace *paVar16;
  ulong uVar17;
  uint dim;
  ulong uVar18;
  uint m;
  ulong uVar19;
  uint i;
  size_t __n;
  ulong uVar20;
  char *sz;
  char *car;
  undefined4 local_10d0;
  undefined4 local_10cc;
  undefined4 local_10c8;
  undefined4 local_10c4;
  uint local_10c0;
  int twosided;
  aiMesh *local_10b8;
  ulong local_10b0;
  char *buffer;
  uint local_109c;
  ai_real *vec [3];
  vector<char,_std::allocator<char>_> mBuffer2;
  char line [4096];
  IOStream *stream;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)line,"rb",(allocator<char> *)&mBuffer2);
  iVar3 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,line._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::~string((string *)line);
  if (stream == (IOStream *)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   "Failed to open OFF file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)line,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mBuffer2,
                   ".");
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)line);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  BaseImporter::TextFileToBuffer(stream,&mBuffer2,FORBID_EMPTY);
  end = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish;
  buffer = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  car = mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start;
  NextToken(&car,mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish);
  pcVar15 = end + -2;
  if (((car < pcVar15) && (*car == 'S')) && (car[1] == 'T')) {
    car = car + 2;
    pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
    local_10d0 = SUB84(pcVar15,0);
  }
  else {
    local_10d0 = 0;
  }
  pcVar1 = end + -1;
  if ((car < pcVar1) && (*car == 'C')) {
    car = car + 1;
    pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
    local_10c8 = SUB84(pcVar15,0);
  }
  else {
    local_10c8 = 0;
  }
  if ((car < pcVar1) && (*car == 'N')) {
    car = car + 1;
    pcVar15 = (char *)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
    local_10c4 = SUB84(pcVar15,0);
  }
  else {
    local_10c4 = 0;
  }
  if ((car < pcVar1) && (*car == '4')) {
    car = car + 1;
    local_10cc = (undefined4)CONCAT71((int7)((ulong)pcVar15 >> 8),1);
  }
  else {
    local_10cc = 0;
  }
  if ((car < pcVar1) && (*car == 'n')) {
    car = car + 1;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  if ((((car < end + -3) && (*car == 'O')) && (car[1] == 'F')) && (car[2] == 'F')) {
    car = car + 3;
    NextToken(&car,end);
  }
  else {
    NextToken(&car,end);
    if ((pcVar1 <= car) || ((byte)(*car - 0x3aU) < 0xf6)) {
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)line,"OFF: Header is invalid",(allocator<char> *)vec);
      DeadlyImportError::DeadlyImportError(pDVar6,(string *)line);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_10cc = 0;
  }
  if (bVar2) {
    uVar4 = strtoul10(car,&car);
    NextToken(&car,end);
    if (3 < uVar4) {
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)line,"OFF: Number of vertex coordinates higher than 3 unsupported",
                 (allocator<char> *)vec);
      DeadlyImportError::DeadlyImportError(pDVar6,(string *)line);
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    uVar4 = 3;
  }
  NextToken(&car,end);
  uVar5 = strtoul10(car,&car);
  local_10b0 = CONCAT44(extraout_var_00,uVar5);
  NextToken(&car,end);
  local_10c0 = strtoul10(car,&car);
  NextToken(&car,end);
  strtoul10(car,&car);
  NextToken(&car,end);
  if ((uint)local_10b0 == 0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)line,"OFF: There are no valid vertices",(allocator<char> *)vec);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)line);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_10c0 == 0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)line,"OFF: There are no valid faces",(allocator<char> *)vec);
    DeadlyImportError::DeadlyImportError(pDVar6,(string *)line);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pScene->mNumMeshes = 1;
  ppaVar7 = (aiMesh **)operator_new__(8);
  pScene->mMeshes = ppaVar7;
  local_109c = uVar4;
  this_00 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(this_00);
  *pScene->mMeshes = this_00;
  this_00->mNumFaces = local_10c0;
  uVar19 = (ulong)local_10c0;
  puVar8 = (ulong *)operator_new__(uVar19 * 0x10 + 8);
  *puVar8 = uVar19;
  paVar16 = (aiFace *)(puVar8 + 1);
  do {
    paVar16->mNumIndices = 0;
    paVar16->mIndices = (uint *)0x0;
    paVar16 = paVar16 + 1;
  } while (paVar16 != (aiFace *)(puVar8 + uVar19 * 2 + 1));
  this_00->mFaces = (aiFace *)(puVar8 + 1);
  this_00->mNumVertices = (uint)local_10b0;
  uVar19 = local_10b0 & 0xffffffff;
  uVar17 = uVar19 * 0xc;
  paVar9 = (aiVector3D *)operator_new__(uVar17);
  __s = (aiVector3D *)0x0;
  __n = ((uVar17 - 0xc) - (uVar17 - 0xc) % 0xc) + 0xc;
  memset(paVar9,0,__n);
  this_00->mVertices = paVar9;
  if ((char)local_10c4 != '\0') {
    __s = (aiVector3D *)operator_new__(uVar17);
    memset(__s,0,__n);
  }
  this_00->mNormals = __s;
  if ((char)local_10c8 == '\0') {
    paVar10 = (aiColor4D *)0x0;
  }
  else {
    paVar10 = (aiColor4D *)operator_new__(uVar19 << 4);
    memset(paVar10,0,uVar19 << 4);
  }
  this_00->mColors[0] = paVar10;
  if ((char)local_10d0 != '\0') {
    this_00->mNumUVComponents[0] = 2;
    paVar9 = (aiVector3D *)operator_new__(uVar17);
    memset(paVar9,0,__n);
    this_00->mTextureCoords[0] = paVar9;
  }
  buffer = car;
  sz = car;
  uVar20 = (ulong)local_109c;
  local_10b8 = this_00;
  for (uVar17 = 0; uVar17 != uVar19; uVar17 = uVar17 + 1) {
    bVar2 = GetNextLine<char>(&buffer,line);
    if (!bVar2) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: The number of verts in the header is incorrect");
      break;
    }
    paVar9 = local_10b8->mVertices;
    vec[0] = &paVar9[uVar17].x;
    vec[1] = &paVar9[uVar17].y;
    vec[2] = &paVar9[uVar17].z;
    sz = line;
    for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,vec[uVar18],true);
    }
    if ((char)local_10cc != '\0') {
      SkipSpaces<char>(&sz);
      twosided = 0x3f800000;
      sz = fast_atoreal_move<float>(sz,(float *)&twosided,true);
      for (uVar18 = 0; uVar20 != uVar18; uVar18 = uVar18 + 1) {
        *vec[uVar18] = *vec[uVar18] / (float)twosided;
      }
    }
    if ((char)local_10c4 != '\0') {
      paVar9 = local_10b8->mNormals + uVar17;
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&paVar9->x,true);
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&paVar9->y,true);
      SkipSpaces<char>(&sz);
      fast_atoreal_move<float>(sz,&paVar9->z,true);
    }
    if ((char)local_10c8 != '\0') {
      paVar10 = local_10b8->mColors[0] + uVar17;
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&paVar10->r,true);
      if (((ulong)(byte)*sz < 0x24) && ((0x800002400U >> ((ulong)(byte)*sz & 0x3f) & 1) != 0)) {
        paVar10->g = 0.0;
      }
      else {
        SkipSpaces<char>(&sz);
        sz = fast_atoreal_move<float>(sz,&paVar10->g,true);
      }
      if (((ulong)(byte)*sz < 0x24) && ((0x800002400U >> ((ulong)(byte)*sz & 0x3f) & 1) != 0)) {
        paVar10->b = 0.0;
      }
      else {
        SkipSpaces<char>(&sz);
        sz = fast_atoreal_move<float>(sz,&paVar10->b,true);
      }
      if (((ulong)(byte)*sz < 0x24) && ((0x800002400U >> ((ulong)(byte)*sz & 0x3f) & 1) != 0)) {
        paVar10->a = 1.0;
      }
      else {
        SkipSpaces<char>(&sz);
        sz = fast_atoreal_move<float>(sz,&paVar10->a,true);
      }
    }
    if ((char)local_10d0 != '\0') {
      paVar9 = local_10b8->mTextureCoords[0];
      SkipSpaces<char>(&sz);
      sz = fast_atoreal_move<float>(sz,&paVar9[uVar17].x,true);
      SkipSpaces<char>(&sz);
      fast_atoreal_move<float>(sz,&paVar9[uVar17].y,true);
    }
  }
  paVar16 = local_10b8->mFaces;
  iVar3 = (int)local_10b0;
  uVar4 = 0;
  do {
    if (local_10c0 <= uVar4) {
LAB_004392ae:
      paVar13 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar13);
      pScene->mRootNode = paVar13;
      aiString::Set((aiString *)paVar13,"<OFFRoot>");
      pScene->mRootNode->mNumMeshes = 1;
      paVar13 = pScene->mRootNode;
      puVar12 = (uint *)operator_new__((ulong)paVar13->mNumMeshes << 2);
      paVar13->mMeshes = puVar12;
      *pScene->mRootNode->mMeshes = 0;
      pScene->mNumMaterials = 1;
      ppaVar14 = (aiMaterial **)operator_new__(8);
      pScene->mMaterials = ppaVar14;
      this_01 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_01);
      vec[0] = (ai_real *)0x3f19999a3f19999a;
      vec[1] = (ai_real *)0x3f8000003f19999a;
      aiMaterial::AddProperty(this_01,(aiColor4D *)vec,1,"$clr.diffuse",0,0);
      *pScene->mMaterials = this_01;
      twosided = 1;
      aiMaterial::AddProperty(this_01,&twosided,1,"$mat.twosided",0,0);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&mBuffer2.super__Vector_base<char,_std::allocator<char>_>);
      (*stream->_vptr_IOStream[1])();
      return;
    }
    bVar2 = GetNextLine<char>(&buffer,line);
    if (!bVar2) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: The number of faces in the header is incorrect");
      goto LAB_004392ae;
    }
    sz = line;
    SkipSpaces<char>(&sz);
    uVar5 = strtoul10(sz,&sz);
    if (uVar5 - 10 < 0xfffffff7) {
      pLVar11 = DefaultLogger::get();
      Logger::error(pLVar11,"OFF: Faces with zero indices aren\'t allowed");
      local_10b8->mNumFaces = local_10b8->mNumFaces - 1;
    }
    else {
      paVar16->mNumIndices = uVar5;
      puVar12 = (uint *)operator_new__((ulong)(uVar5 << 2));
      paVar16->mIndices = puVar12;
      for (uVar19 = 0; uVar19 < paVar16->mNumIndices; uVar19 = uVar19 + 1) {
        SkipSpaces<char>(&sz);
        uVar5 = strtoul10(sz,&sz);
        if ((uint)local_10b0 <= uVar5) {
          pLVar11 = DefaultLogger::get();
          Logger::error(pLVar11,"OFF: Vertex index is out of range");
          uVar5 = iVar3 - 1;
        }
        paVar16->mIndices[uVar19] = uVar5;
      }
      uVar4 = uVar4 + 1;
      paVar16 = paVar16 + 1;
    }
  } while( true );
}

Assistant:

void OFFImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler) {
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open OFF file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    // Proper OFF header parser. We only implement normal loading for now.
    bool hasTexCoord = false, hasNormals = false, hasColors = false;
    bool hasHomogenous = false, hasDimension = false;
    unsigned int dimensions = 3;
    const char* car = buffer;
    const char* end = buffer + mBuffer2.size();
    NextToken(&car, end);
    
    if (car < end - 2 && car[0] == 'S' && car[1] == 'T') {
      hasTexCoord = true; car += 2;
    }
    if (car < end - 1 && car[0] == 'C') {
      hasColors = true; car++;
    }
    if (car < end- 1 && car[0] == 'N') {
      hasNormals = true; car++;
    }
    if (car < end - 1 && car[0] == '4') {
      hasHomogenous = true; car++;
    }
    if (car < end - 1 && car[0] == 'n') {
      hasDimension = true; car++;
    }
    if (car < end - 3 && car[0] == 'O' && car[1] == 'F' && car[2] == 'F') {
        car += 3;
	NextToken(&car, end);
    } else {
      // in case there is no OFF header (which is allowed by the
      // specification...), then we might have unintentionally read an
      // additional dimension from the primitive count fields
      dimensions = 3;
      hasHomogenous = false;
      NextToken(&car, end);
      
      // at this point the next token should be an integer number
      if (car >= end - 1 || *car < '0' || *car > '9') {
	throw DeadlyImportError("OFF: Header is invalid");
      }
    }
    if (hasDimension) {
        dimensions = strtoul10(car, &car);
	NextToken(&car, end);
    }
    if (dimensions > 3) {
        throw DeadlyImportError
	  ("OFF: Number of vertex coordinates higher than 3 unsupported");
    }

    NextToken(&car, end);
    const unsigned int numVertices = strtoul10(car, &car);
    NextToken(&car, end);
    const unsigned int numFaces = strtoul10(car, &car);
    NextToken(&car, end);
    strtoul10(car, &car);  // skip edge count
    NextToken(&car, end);

    if (!numVertices) {
        throw DeadlyImportError("OFF: There are no valid vertices");
    }
    if (!numFaces) {
        throw DeadlyImportError("OFF: There are no valid faces");
    }

    pScene->mNumMeshes = 1;
    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ];

    aiMesh* mesh = new aiMesh();
    pScene->mMeshes[0] = mesh;

    mesh->mNumFaces = numFaces;
    aiFace* faces = new aiFace[mesh->mNumFaces];
    mesh->mFaces = faces;

    mesh->mNumVertices = numVertices;
    mesh->mVertices = new aiVector3D[numVertices];
    mesh->mNormals = hasNormals ? new aiVector3D[numVertices] : nullptr;
    mesh->mColors[0] = hasColors ? new aiColor4D[numVertices] : nullptr;

    if (hasTexCoord) {
        mesh->mNumUVComponents[0] = 2;
        mesh->mTextureCoords[0] = new aiVector3D[numVertices];
    }
    char line[4096];
    buffer = car;
    const char *sz = car;

    // now read all vertex lines
    for (unsigned int i = 0; i < numVertices; ++i) {
        if(!GetNextLine(buffer, line)) {
            ASSIMP_LOG_ERROR("OFF: The number of verts in the header is incorrect");
            break;
        }
        aiVector3D& v = mesh->mVertices[i];	
        sz = line;

	// helper array to write a for loop over possible dimension values
	ai_real* vec[3] = {&v.x, &v.y, &v.z};

	// stop at dimensions: this allows loading 1D or 2D coordinate vertices
        for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz, *vec[dim]);
	}

	// if has homogenous coordinate, divide others by this one
	if (hasHomogenous) {
	    SkipSpaces(&sz);
	    ai_real w = 1.;
	    sz = fast_atoreal_move<ai_real>(sz, w);
            for (unsigned int dim = 0; dim < dimensions; ++dim ) {
	        *(vec[dim]) /= w;
	    }
	}

	// read optional normals
	if (hasNormals) {
	    aiVector3D& n = mesh->mNormals[i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.x);
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)n.y);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)n.z);
	}
	
	// reading colors is a pain because the specification says it can be
	// integers or floats, and any number of them between 1 and 4 included,
	// until the next comment or end of line
	// in theory should be testing type !
	if (hasColors) {
	    aiColor4D& c = mesh->mColors[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.r);
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.g);
            } else {
	        c.g = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.b);
            } else {
	        c.b = 0.;
	    }
            if (*sz != '#' && *sz != '\n' && *sz != '\r') {
	        SkipSpaces(&sz);
	        sz = fast_atoreal_move<ai_real>(sz,(ai_real&)c.a);
            } else {
	        c.a = 1.;
	    }
	}
        if (hasTexCoord) {
	    aiVector3D& t = mesh->mTextureCoords[0][i];
	    SkipSpaces(&sz);
	    sz = fast_atoreal_move<ai_real>(sz,(ai_real&)t.x);
	    SkipSpaces(&sz);
	    fast_atoreal_move<ai_real>(sz,(ai_real&)t.y);
	}
    }

    // load faces with their indices
    faces = mesh->mFaces;
    for (unsigned int i = 0; i < numFaces; ) {
        if(!GetNextLine(buffer,line)) {
            ASSIMP_LOG_ERROR("OFF: The number of faces in the header is incorrect");
            break;
        }
        unsigned int idx;
        sz = line; SkipSpaces(&sz);
        idx = strtoul10(sz,&sz);
        if(!idx || idx > 9) {
	    ASSIMP_LOG_ERROR("OFF: Faces with zero indices aren't allowed");
            --mesh->mNumFaces;
            continue;
	}
	faces->mNumIndices = idx;
        faces->mIndices = new unsigned int[faces->mNumIndices];
        for (unsigned int m = 0; m < faces->mNumIndices;++m) {
            SkipSpaces(&sz);
            idx = strtoul10(sz,&sz);
            if (idx >= numVertices) {
                ASSIMP_LOG_ERROR("OFF: Vertex index is out of range");
                idx = numVertices - 1;
            }
            faces->mIndices[m] = idx;
        }
        ++i;
        ++faces;
    }
    
    // generate the output node graph
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<OFFRoot>");
    pScene->mRootNode->mNumMeshes = 1;
    pScene->mRootNode->mMeshes = new unsigned int [pScene->mRootNode->mNumMeshes];
    pScene->mRootNode->mMeshes[0] = 0;

    // generate a default material
    pScene->mNumMaterials = 1;
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    aiMaterial* pcMat = new aiMaterial();

    aiColor4D clr( ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 0.6 ), ai_real( 1.0 ) );
    pcMat->AddProperty(&clr,1,AI_MATKEY_COLOR_DIFFUSE);
    pScene->mMaterials[0] = pcMat;

    const int twosided = 1;
    pcMat->AddProperty(&twosided, 1, AI_MATKEY_TWOSIDED);
}